

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::Write_2(ON_Mesh *this,int Vcount,ON_BinaryArchive *file)

{
  endian eVar1;
  int iVar2;
  int iVar3;
  ON_3fPoint *pOVar4;
  ON_3fPoint *pOVar5;
  ON_3fVector *pOVar6;
  ON_3fVector *pOVar7;
  ON_2fPoint *pOVar8;
  ON_2fPoint *pOVar9;
  ON_SurfaceCurvature *pOVar10;
  ON_SurfaceCurvature *pOVar11;
  ON_Color *pOVar12;
  ON_Color *pOVar13;
  int local_70;
  int local_68;
  int local_60;
  int local_58;
  int Ccount;
  int Kcount;
  int Tcount;
  int Ncount;
  bool rc;
  endian e;
  ON_BinaryArchive *file_local;
  int Vcount_local;
  ON_Mesh *this_local;
  
  eVar1 = ON_BinaryArchive::Endian(file);
  Tcount._3_1_ = true;
  iVar2 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  if (iVar2 < Vcount) {
    this_local._7_1_ = false;
  }
  else {
    if (0 < Vcount) {
      iVar2 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      iVar3 = ON_SimpleArray<ON_3fVector>::Count(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
      local_58 = Vcount;
      if (iVar2 != iVar3) {
        local_58 = 0;
      }
      iVar2 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      iVar3 = ON_SimpleArray<ON_2fPoint>::Count(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
      local_60 = Vcount;
      if (iVar2 != iVar3) {
        local_60 = 0;
      }
      iVar2 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      iVar3 = ON_SimpleArray<ON_SurfaceCurvature>::Count(&this->m_K);
      local_68 = Vcount;
      if (iVar2 != iVar3) {
        local_68 = 0;
      }
      iVar2 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      iVar3 = ON_SimpleArray<ON_Color>::Count(&this->m_C);
      local_70 = Vcount;
      if (iVar2 != iVar3) {
        local_70 = 0;
      }
      if (eVar1 == big_endian) {
        pOVar4 = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
        pOVar5 = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
        ON_BinaryArchive::ToggleByteOrder((long)(Vcount * 3),4,pOVar4,pOVar5);
        pOVar6 = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
        pOVar7 = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
        ON_BinaryArchive::ToggleByteOrder((long)(local_58 * 3),4,pOVar6,pOVar7);
        pOVar8 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
        pOVar9 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
        ON_BinaryArchive::ToggleByteOrder((long)(local_60 << 1),4,pOVar8,pOVar9);
        pOVar10 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
        pOVar11 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
        ON_BinaryArchive::ToggleByteOrder((long)(local_68 << 1),8,pOVar10,pOVar11);
        pOVar12 = ON_SimpleArray<ON_Color>::Array(&this->m_C);
        pOVar13 = ON_SimpleArray<ON_Color>::Array(&this->m_C);
        ON_BinaryArchive::ToggleByteOrder((long)local_70,4,pOVar12,pOVar13);
      }
      pOVar4 = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      Tcount._3_1_ = ON_BinaryArchive::WriteCompressedBuffer(file,(long)Vcount * 0xc,pOVar4);
      if (Tcount._3_1_) {
        pOVar6 = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
        Tcount._3_1_ = ON_BinaryArchive::WriteCompressedBuffer(file,(long)local_58 * 0xc,pOVar6);
      }
      if (Tcount._3_1_ != false) {
        pOVar8 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
        Tcount._3_1_ = ON_BinaryArchive::WriteCompressedBuffer(file,(long)local_60 << 3,pOVar8);
      }
      if (Tcount._3_1_ != false) {
        pOVar10 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
        Tcount._3_1_ = ON_BinaryArchive::WriteCompressedBuffer(file,(long)local_68 << 4,pOVar10);
      }
      if (Tcount._3_1_ != false) {
        pOVar12 = ON_SimpleArray<ON_Color>::Array(&this->m_C);
        Tcount._3_1_ = ON_BinaryArchive::WriteCompressedBuffer(file,(long)local_70 << 2,pOVar12);
      }
      if (eVar1 == big_endian) {
        pOVar4 = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
        pOVar5 = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
        ON_BinaryArchive::ToggleByteOrder((long)(Vcount * 3),4,pOVar4,pOVar5);
        pOVar6 = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
        pOVar7 = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
        ON_BinaryArchive::ToggleByteOrder((long)(local_58 * 3),4,pOVar6,pOVar7);
        pOVar8 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
        pOVar9 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
        ON_BinaryArchive::ToggleByteOrder((long)(local_60 << 1),4,pOVar8,pOVar9);
        pOVar10 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
        pOVar11 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
        ON_BinaryArchive::ToggleByteOrder((long)(local_68 << 1),8,pOVar10,pOVar11);
        pOVar12 = ON_SimpleArray<ON_Color>::Array(&this->m_C);
        pOVar13 = ON_SimpleArray<ON_Color>::Array(&this->m_C);
        ON_BinaryArchive::ToggleByteOrder((long)local_70,4,pOVar12,pOVar13);
      }
    }
    this_local._7_1_ = Tcount._3_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Mesh::Write_2( int Vcount, ON_BinaryArchive& file ) const
{
  // ver 2.0 compressed format
  const ON::endian e = file.Endian();

  bool rc = true;

  if ( Vcount > m_V.Count() )
    return false;

  if ( Vcount > 0 ) 
  {
    const int Ncount = (m_V.Count() == m_N.Count()) ? Vcount : 0;
    const int Tcount = (m_V.Count() == m_T.Count()) ? Vcount : 0;
    const int Kcount = (m_V.Count() == m_K.Count()) ? Vcount : 0;
    const int Ccount = (m_V.Count() == m_C.Count()) ? Vcount : 0;

    if (e == ON::endian::big_endian)
    {
      // These calls temporarily put the m_V[], m_N[], m_T[], m_K[]
      // and m_C[] arrays in little endian byte order because 3dm archives
      // are always in little endian byte order.
      //
      // This code assumes sizeof(ON_Color)=4, sizeof(float)=4 
      // and sizeof(double)=8.
      // If this is not the case, then changing the 4's and 8's below
      // will not work.  You will have to copy the mesh definition
      // into temporary arrays of 4 byte floats/8 byte doubles
      // and them compress the temporary arrays.  If you do this,
      // then remove the "restore" byte order calls below.
      file.ToggleByteOrder( Vcount*3, 4, m_V.Array(), (void*)m_V.Array() );
      file.ToggleByteOrder( Ncount*3, 4, m_N.Array(), (void*)m_N.Array() );
      file.ToggleByteOrder( Tcount*2, 4, m_T.Array(), (void*)m_T.Array() );
      file.ToggleByteOrder( Kcount*2, 8, m_K.Array(), (void*)m_K.Array() );
      file.ToggleByteOrder( Ccount,   4, m_C.Array(), (void*)m_C.Array() );
    }
    if (rc) rc = file.WriteCompressedBuffer( Vcount*sizeof(ON_3fPoint),         m_V.Array() );
    if (rc) rc = file.WriteCompressedBuffer( Ncount*sizeof(ON_3fVector),        m_N.Array() );
    if (rc) rc = file.WriteCompressedBuffer( Tcount*sizeof(ON_2fPoint),         m_T.Array() );
    if (rc) rc = file.WriteCompressedBuffer( Kcount*sizeof(ON_SurfaceCurvature),m_K.Array() );
    if (rc) rc = file.WriteCompressedBuffer( Ccount*sizeof(ON_Color),           m_C.Array() );
    if (e == ON::endian::big_endian)
    {
      // These calls restore the m_V[], m_N[], m_T[], m_K[] and m_C[] arrays
      // to the correct big endian runtime byte order.  This must be done even
      // if rc is false.
      file.ToggleByteOrder( Vcount*3, 4, m_V.Array(), (void*)m_V.Array() );
      file.ToggleByteOrder( Ncount*3, 4, m_N.Array(), (void*)m_N.Array() );
      file.ToggleByteOrder( Tcount*2, 4, m_T.Array(), (void*)m_T.Array() );
      file.ToggleByteOrder( Kcount*2, 8, m_K.Array(), (void*)m_K.Array() );
      file.ToggleByteOrder( Ccount,   4, m_C.Array(), (void*)m_C.Array() );
    }
  }

  return rc;
}